

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O3

void Sat_MmStepRestart(Sat_MmStep_t *p)

{
  int iVar1;
  long lVar2;
  
  if (p->nChunksAlloc != 0) {
    iVar1 = p->nChunks;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->pChunks[lVar2] != (char *)0x0) {
          free(p->pChunks[lVar2]);
          p->pChunks[lVar2] = (char *)0x0;
          iVar1 = p->nChunks;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    p->nChunks = 0;
  }
  if (0 < p->nMems) {
    lVar2 = 0;
    do {
      Sat_MmFixedRestart(p->pMems[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < p->nMems);
  }
  return;
}

Assistant:

void Sat_MmStepRestart( Sat_MmStep_t * p )
{
    int i;
    if ( p->nChunksAlloc )
    {
        for ( i = 0; i < p->nChunks; i++ )
            ABC_FREE( p->pChunks[i] );
        p->nChunks = 0;
    }
    for ( i = 0; i < p->nMems; i++ )
        Sat_MmFixedRestart( p->pMems[i] );
}